

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstructCondense<float>::SolveSystemPhi(TPZDohrSubstructCondense<float> *this)

{
  TPZFMatrix<float> *this_00;
  float *pfVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  TPZFMatrix<float> rhs;
  TPZFMatrix<float> local_c0;
  
  uVar3 = (uint)(this->fCoarseNodes).fNElements;
  lVar5 = (long)(int)(this->fNEquations + uVar3);
  lVar4 = (long)(int)uVar3;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar5;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar4;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar6 = lVar5 * lVar4;
  if (uVar6 != 0) {
    local_c0.fElem = (float *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
    if (0 < (long)uVar6) {
      memset(local_c0.fElem,0,uVar6 * 4);
    }
  }
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      iVar2 = this->fNEquations + (int)uVar6;
      if (((iVar2 < 0) || (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= iVar2)) ||
         (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_c0.fElem[local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar6 + (long)iVar2]
           = 1.0;
      uVar6 = uVar6 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar6);
  }
  TPZMatRed<float,_TPZFMatrix<float>_>::SetF(((this->fMatRedComplete).fRef)->fPointer,&local_c0);
  this_00 = &this->fKCi;
  TPZFMatrix<float>::Resize(this_00,lVar4,lVar4);
  TPZMatRed<float,_TPZFMatrix<float>_>::U1(((this->fMatRedComplete).fRef)->fPointer,this_00);
  TPZMatRed<float,_TPZFMatrix<float>_>::UGlobal
            (((this->fMatRedComplete).fRef)->fPointer,this_00,&local_c0);
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      if (((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
         ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar5 = (this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar6;
      pfVar1 = (this->fKCi).fElem;
      pfVar1[lVar5 + uVar6] = pfVar1[lVar5 + uVar6] + 10.0;
      uVar7 = 0;
      do {
        if (((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
           ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar5 = (this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow;
        if ((lVar5 <= (long)uVar6) ||
           ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (this->fKCi).fElem
        [(this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar7 + uVar6] =
             -(this->fKCi).fElem[lVar5 * uVar7 + uVar6];
        uVar7 = uVar7 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar7);
      if (((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
         ((this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      (this->fWeights).super_TPZVec<float>.fStore[(this->fCoarseNodes).fStore[uVar6]] =
           (this->fKCi).fElem
           [(this->fKCi).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar6 + uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uVar3 & 0x7fffffff));
  }
  TPZFMatrix<float>::Resize(&this->fPhiC,(long)this->fNEquations,lVar4);
  if (0 < this->fNEquations) {
    lVar4 = 0;
    do {
      if (0 < (int)uVar3) {
        uVar6 = 0;
        do {
          if ((local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar4) ||
             (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar4) ||
             ((this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
            TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (this->fPhiC).fElem
          [(this->fPhiC).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar6 + lVar4] =
               local_c0.fElem
               [local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow * uVar6 + lVar4];
          uVar6 = uVar6 + 1;
        } while ((uVar3 & 0x7fffffff) != uVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->fNEquations);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseNodes.NElements();
	int i,j;
	TPZFMatrix<TVar> rhs(this->fNEquations+ncoarse,ncoarse,0.);
	for(i=0; i<ncoarse; i++)
	{
		rhs(fNEquations+i,i) = 1.;
	}
	fMatRedComplete->SetF(rhs);
	fKCi.Resize(ncoarse,ncoarse);
	fMatRedComplete->U1(fKCi);
	fMatRedComplete->UGlobal(fKCi,rhs);
	for(i=0; i<ncoarse; i++) 
	{
		fKCi(i,i) += 10.;
		for(j=0; j<ncoarse; j++)
		{
			fKCi(i,j) = -fKCi(i,j);
		}
		fWeights[fCoarseNodes[i]] = fKCi(i,i);
	}
	fPhiC.Resize(fNEquations,ncoarse);
	for(i=0; i<fNEquations; i++)
	{
		for(j=0; j<ncoarse; j++)
		{
			fPhiC(i,j) = rhs(i,j);
		}
	}
}